

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O0

void __thiscall gurkenlaeufer::ExamplesState::~ExamplesState(ExamplesState *this)

{
  ExamplesState *this_local;
  
  ~ExamplesState(this);
  operator_delete(this);
  return;
}

Assistant:

ExamplesState(IParserStateFactory& factory, Scenario scenario, std::list<Step> backgroundSteps, const IScenarioCollectionSPtr& scenarioCollection)
        : CommonParserState(factory)
        , _scenario(std::move(scenario))
        , _backgroundSteps(std::move(backgroundSteps))
        , _scenarioCollection(scenarioCollection)
        , _isTableHead(true)
        , _exampleCount(0)
    {
    }